

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O1

void lumeview::MessageQueue::dispatch(void)

{
  pointer ppMVar1;
  _Elt_pointer psVar2;
  MessageReceiver **receiver;
  pointer ppMVar3;
  value_type *msg;
  MessageReceiver **receiver_1;
  
  inst();
  ppMVar1 = inst::mq.m_receivers.
            super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar3 = inst::mq.m_receivers.
                 super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar3 != ppMVar1;
      ppMVar3 = ppMVar3 + 1) {
    (*(*ppMVar3)->_vptr_MessageReceiver[2])();
  }
  inst();
  ppMVar3 = inst::mq.m_receivers.
            super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppMVar1 = inst::mq.m_receivers.
            super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = inst::mq.m_messages.c.
           super__Deque_base<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (inst::mq.m_messages.c.
      super__Deque_base<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      inst::mq.m_messages.c.
      super__Deque_base<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      for (; ppMVar3 != ppMVar1; ppMVar3 = ppMVar3 + 1) {
        (*(*ppMVar3)->_vptr_MessageReceiver[4])
                  (*ppMVar3,(psVar2->
                            super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr);
      }
      std::
      deque<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
      ::pop_front((deque<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
                   *)&inst::mq);
      ppMVar3 = inst::mq.m_receivers.
                super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppMVar1 = inst::mq.m_receivers.
                super__Vector_base<lumeview::MessageReceiver_*,_std::allocator<lumeview::MessageReceiver_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar2 = inst::mq.m_messages.c.
               super__Deque_base<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while (inst::mq.m_messages.c.
             super__Deque_base<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             inst::mq.m_messages.c.
             super__Deque_base<std::shared_ptr<const_lumeview::Message>,_std::allocator<std::shared_ptr<const_lumeview::Message>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  for (; ppMVar3 != ppMVar1; ppMVar3 = ppMVar3 + 1) {
    (*(*ppMVar3)->_vptr_MessageReceiver[3])();
  }
  return;
}

Assistant:

void MessageQueue::dispatch ()
{
	auto& receivers = inst().m_receivers;
	for(auto& receiver : receivers)
		receiver->message_dispatch_begins ();

	auto& messages = inst().m_messages;
	while (!messages.empty()) {
		auto& msg = messages.front();
		for(auto& receiver : receivers)
			receiver->receive_message (*msg);
		messages.pop();
	}

	for(auto& receiver : receivers)
		receiver->message_dispatch_ends ();
}